

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapcode.cpp
# Opt level: O1

void selfCheckMapcodeToLatLon(char *mapcode,double lat,double lon)

{
  MapcodeError MVar1;
  ulong uVar2;
  double foundLon;
  double foundLat;
  double local_18;
  double local_10;
  
  MVar1 = decodeMapcodeToLatLonUtf8
                    (&local_10,&local_18,mapcode,TERRITORY_NONE,(MapcodeElements *)0x0);
  if (MVar1 == ERR_OK) {
    local_10 = local_10 - lat;
    uVar2 = -(ulong)(local_10 < -local_10);
    local_18 = local_18 - lon;
    if (local_18 <= -local_18) {
      local_18 = -local_18;
    }
    if ((0.001 < (double)(~uVar2 & (ulong)local_10 | (ulong)-local_10 & uVar2)) ||
       (0.001 < (double)(~-(ulong)(180.0 < local_18) & (ulong)local_18 |
                        (ulong)(360.0 - local_18) & -(ulong)(180.0 < local_18)))) {
      fprintf(_stderr,
              "error: decoding mapcode to lat/lon failure; lat=%.20g, lon=%.20g produces mapcode %s, which decodes to lat=%.20g (delta=%.20g), lon=%.20g (delta=%.20g)\n"
              ,lat,lon,mapcode);
      if (selfCheckEnabled != 0) {
        exit(2);
      }
    }
  }
  else {
    selfCheckMapcodeToLatLon();
  }
  return;
}

Assistant:

static void selfCheckMapcodeToLatLon(const char *mapcode,
                                     const double lat, const double lon) {
    double foundLat;
    double foundLon;
    // TODO: Fix self-check.
    // int foundContext = getTerritoryCode(territory, TERRITORY_NONE);
    enum Territory foundContext = TERRITORY_NONE;
    int err = decodeMapcodeToLatLonUtf8(&foundLat, &foundLon, mapcode, foundContext, NULL);
    if (err != 0) {
        fprintf(stderr, "error: decoding mapcode to lat/lon failure; "
                "cannot decode '%s')\n", mapcode);
        if (selfCheckEnabled) {
            exit(INTERNAL_ERROR);
        }
        return;
    }
    double deltaLat = ((foundLat - lat) >= 0.0 ? (foundLat - lat) : -(foundLat - lat));
    double deltaLon = ((foundLon - lon) > -0.0 ? (foundLon - lon) : -(foundLon - lon));
    if (deltaLon > 180.0) {
        deltaLon = 360.0 - deltaLon;
    }
    if ((deltaLat > DELTA) || (deltaLon > DELTA)) {
        fprintf(stderr, "error: decoding mapcode to lat/lon failure; "
                        "lat=%.20g, lon=%.20g produces mapcode %s, "
                        "which decodes to lat=%.20g (delta=%.20g), lon=%.20g (delta=%.20g)\n",
                lat, lon, mapcode, foundLat, deltaLat, foundLon, deltaLon);
        if (selfCheckEnabled) {
            exit(INTERNAL_ERROR);
        }
        return;
    }
}